

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLocusTanFixedRadiusArc.cpp
# Opt level: O0

bool ParseLocusTanFixedRadiusArc1
               (string *sLine1,string *sTestId,string *sGeoStartLat,string *sGeoStartLon,
               string *sGeoEndLat,string *sGeoEndLon,string *sLocusStartLat,string *sLocusStartLon,
               string *sLocusEndLat,string *sLocusEndLon,string *sLocusStartDist,
               string *sLocusEndDist)

{
  bool bVar1;
  syntax_option_type __f;
  value_type *pvVar2;
  regex_error *e;
  string_type local_8b8;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_898;
  string_type local_810;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_7f0;
  string_type local_768;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_748;
  string_type local_6c0;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_6a0;
  string_type local_618;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_5f8;
  string_type local_570;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_550;
  string_type local_4c8;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_4a8;
  string_type local_420;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_400;
  string_type local_378;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_358;
  string_type local_2d0;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_2b0;
  string_type local_228;
  undefined1 local_208 [8];
  sregex_token_iterator s_end;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  undefined1 local_160 [8];
  sregex_token_iterator it;
  int sub_matches [11];
  undefined1 local_a0 [8];
  regex pat;
  undefined1 local_78 [8];
  string sRxPat;
  syntax_option_type flags;
  bool bPassed;
  string *sGeoEndLon_local;
  string *sGeoEndLat_local;
  string *sGeoStartLon_local;
  string *sGeoStartLat_local;
  string *sTestId_local;
  string *sLine1_local;
  
  trim(sLine1," \t\n\r\f\v");
  __f = std::regex_constants::operator|(1,0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_78,"([a-zA-Z]*\\d*)[,]",
             (allocator *)
             ((long)&pat._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pat._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::__cxx11::string::operator+=((string *)local_78,"[0-9A-z ]+[,]");
  std::__cxx11::string::operator+=
            ((string *)local_78,
             "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]")
  ;
  std::__cxx11::string::operator+=
            ((string *)local_78,
             "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]")
  ;
  std::__cxx11::string::operator+=
            ((string *)local_78,
             "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]")
  ;
  std::__cxx11::string::operator+=
            ((string *)local_78,
             "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]")
  ;
  std::__cxx11::string::operator+=
            ((string *)local_78,"([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)");
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,__f);
  it._M_has_m1 = true;
  it._129_7_ = 0x2000000;
  local_170._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_168,&local_170);
  s_end._128_8_ = std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_178,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&s_end._M_has_m1);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
  ::regex_token_iterator<11ul>
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
              *)local_160,local_168,local_178,(regex_type *)local_a0,(int (*) [11])&it._M_has_m1,0);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_208);
  bVar1 = std::__cxx11::
          regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::operator!=((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_160,
                       (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_208);
  if (bVar1) {
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_2b0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_160,0);
    pvVar2 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_2b0);
    std::__cxx11::sub_match::operator_cast_to_string(&local_228,(sub_match *)pvVar2);
    std::__cxx11::string::operator=((string *)sTestId,(string *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_2b0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_358,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_160,0);
    pvVar2 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_358);
    std::__cxx11::sub_match::operator_cast_to_string(&local_2d0,(sub_match *)pvVar2);
    std::__cxx11::string::operator=((string *)sGeoStartLat,(string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_358);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_400,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_160,0);
    pvVar2 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_400);
    std::__cxx11::sub_match::operator_cast_to_string(&local_378,(sub_match *)pvVar2);
    std::__cxx11::string::operator=((string *)sGeoStartLon,(string *)&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_400);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_4a8,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_160,0);
    pvVar2 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_4a8);
    std::__cxx11::sub_match::operator_cast_to_string(&local_420,(sub_match *)pvVar2);
    std::__cxx11::string::operator=((string *)sGeoEndLat,(string *)&local_420);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_4a8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_550,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_160,0);
    pvVar2 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_550);
    std::__cxx11::sub_match::operator_cast_to_string(&local_4c8,(sub_match *)pvVar2);
    std::__cxx11::string::operator=((string *)sGeoEndLon,(string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_550);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_5f8,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_160,0);
    pvVar2 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_5f8);
    std::__cxx11::sub_match::operator_cast_to_string(&local_570,(sub_match *)pvVar2);
    std::__cxx11::string::operator=((string *)sLocusStartLat,(string *)&local_570);
    std::__cxx11::string::~string((string *)&local_570);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_5f8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_6a0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_160,0);
    pvVar2 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_6a0);
    std::__cxx11::sub_match::operator_cast_to_string(&local_618,(sub_match *)pvVar2);
    std::__cxx11::string::operator=((string *)sLocusStartLon,(string *)&local_618);
    std::__cxx11::string::~string((string *)&local_618);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_6a0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_748,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_160,0);
    pvVar2 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_748);
    std::__cxx11::sub_match::operator_cast_to_string(&local_6c0,(sub_match *)pvVar2);
    std::__cxx11::string::operator=((string *)sLocusEndLat,(string *)&local_6c0);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_748);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_7f0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_160,0);
    pvVar2 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_7f0);
    std::__cxx11::sub_match::operator_cast_to_string(&local_768,(sub_match *)pvVar2);
    std::__cxx11::string::operator=((string *)sLocusEndLon,(string *)&local_768);
    std::__cxx11::string::~string((string *)&local_768);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_7f0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_898,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_160,0);
    pvVar2 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_898);
    std::__cxx11::sub_match::operator_cast_to_string(&local_810,(sub_match *)pvVar2);
    std::__cxx11::string::operator=((string *)sLocusStartDist,(string *)&local_810);
    std::__cxx11::string::~string((string *)&local_810);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_898);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&e,(regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_160,0);
    pvVar2 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                          *)&e);
    std::__cxx11::sub_match::operator_cast_to_string(&local_8b8,(sub_match *)pvVar2);
    std::__cxx11::string::operator=((string *)sLocusEndDist,(string *)&local_8b8);
    std::__cxx11::string::~string((string *)&local_8b8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&e);
  }
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_208);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_160);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_a0);
  std::__cxx11::string::~string((string *)local_78);
  return bVar1;
}

Assistant:

bool ParseLocusTanFixedRadiusArc1(string sLine1, string &sTestId, string &sGeoStartLat, string &sGeoStartLon,
                                  string &sGeoEndLat, string &sGeoEndLon,
                                  string &sLocusStartLat, string &sLocusStartLon, string &sLocusEndLat,
                                  string &sLocusEndLon,
                                  string &sLocusStartDist, string &sLocusEndDist)
{
    bool bPassed = false;
    trim(sLine1);
    try
    {
        regex_constants::syntax_option_type flags = regex_constants::icase | regex_constants::ECMAScript;

        string sRxPat = "([a-zA-Z]*\\d*)[,]";
        sRxPat += "[0-9A-z ]+[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)";

        regex pat(sRxPat, flags);
        int const sub_matches[] = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11};
        sregex_token_iterator it(sLine1.begin(), sLine1.end(), pat, sub_matches);
        sregex_token_iterator s_end;
        if (it != s_end)
        {
            sTestId = *it++;
            sGeoStartLat = *it++;
            sGeoStartLon = *it++;
            sGeoEndLat = *it++;
            sGeoEndLon = *it++;
            sLocusStartLat = *it++;
            sLocusStartLon = *it++;
            sLocusEndLat = *it++;
            sLocusEndLon = *it++;
            sLocusStartDist = *it++;
            sLocusEndDist = *it++;
            bPassed = true;
        }
    }
    catch (regex_error &e)
    {
        cout << "\n" << e.what();
        return false;
    }
    return bPassed;
}